

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

TValue * cpcparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  BCLine hashline;
  byte *pbVar1;
  CTState *cts;
  long lVar2;
  undefined1 uVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  CTypeID CVar7;
  int iVar8;
  CPToken CVar9;
  CPscl CVar10;
  CTypeID id;
  ulong uVar11;
  ErrMsg em;
  long lVar12;
  CType *ct;
  CType *local_6b8;
  CPDecl decl;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  *(undefined8 *)((long)ud + 0x58) = 1;
  *(undefined1 *)((long)ud + 0x6f) = 0;
  *(undefined1 *)((long)ud + 0x68) = 0xff;
  *(undefined4 *)((long)ud + 0x34) = *(undefined4 *)((long)ud + 0x38);
  *(undefined8 *)((long)ud + 0x28) = 0;
  *(undefined4 *)((long)ud + 0x30) = 0;
  pbVar1 = *(byte **)((long)ud + 0x20);
  *(byte **)((long)ud + 0x20) = pbVar1 + 1;
  uVar6 = (uint)*pbVar1;
  *(uint *)ud = uVar6;
  if (uVar6 == 0x5c) {
    cp_get_bs((CPState *)ud);
  }
  *(undefined4 *)((long)ud + 4) = 0;
  *(undefined4 *)((long)ud + 0x60) = 0x38c0;
  cp_next((CPState *)ud);
  if ((*(byte *)((long)ud + 100) & 1) == 0) {
    cp_decl_spec((CPState *)ud,&decl,0);
    cp_declarator((CPState *)ud,&decl);
    CVar7 = cp_decl_intern((CPState *)ud,&decl);
    *(CTypeID *)((long)ud + 0xc) = CVar7;
    if (*(int *)((long)ud + 4) != 0x103) {
      cp_err_token((CPState *)ud,0x103);
    }
LAB_0014cec9:
    if ((*(long *)((long)ud + 0x48) != 0) &&
       (*(long *)((long)ud + 0x48) != *(long *)(*(long *)((long)ud + 0x38) + 0x18))) {
      cp_err((CPState *)ud,LJ_ERR_FFI_NUMPARAM);
    }
    return (TValue *)0x0;
  }
  bVar4 = true;
LAB_0014cf05:
  if (*(int *)((long)ud + 4) != 0x103) {
    iVar8 = cp_opt((CPState *)ud,0x3b);
    if (iVar8 != 0) goto LAB_0014d115;
    if (*(int *)((long)ud + 4) != 0x23) {
      CVar10 = cp_decl_spec((CPState *)ud,&decl,0x38000);
      iVar8 = *(int *)((long)ud + 4);
      if ((((iVar8 != 0x103) && (iVar8 != 0x3b)) ||
          ((decl.stack[0].info & 0xf0000000) != 0x70000000)) ||
         (((*(uint *)(**(long **)((long)ud + 0x40) + (ulong)((decl.stack[0].info & 0xffff) << 4)) >>
           0x1c) - 1 & 0xfffffffb) != 0)) {
        do {
          cp_declarator((CPState *)ud,&decl);
          CVar7 = cp_decl_intern((CPState *)ud,&decl);
          if ((decl.name != (GCstr *)0x0) && (decl.nameid == 0)) {
            cts = *(CTState **)((long)ud + 0x40);
            if ((short)CVar10 < 0) {
              id = lj_ctype_new(cts,&ct);
              ct->info = CVar7 + 0x70000000;
            }
            else {
              if ((cts->tab[CVar7].info & 0xf0000000) == 0x60000000) {
                ct = cts->tab + CVar7;
                id = CVar7;
              }
              else {
                if ((CVar10 >> 0x11 & 1) != 0) {
                  id = cp_decl_constinit((CPState *)ud,&ct,CVar7);
                  goto LAB_0014d0c0;
                }
                id = lj_ctype_new(cts,&ct);
                ct->info = CVar7 + 0xc0000000;
              }
              if (decl.redir != (GCstr *)0x0) {
                CVar7 = lj_ctype_new(*(CTState **)((long)ud + 0x40),&local_6b8);
                lVar2 = **(long **)((long)ud + 0x40);
                lVar12 = (ulong)id * 0x10;
                ct = (CType *)(lVar2 + lVar12);
                local_6b8->info = 0x80040000;
                local_6b8->sib = *(CTypeID1 *)(lVar2 + 8 + lVar12);
                *(short *)(lVar2 + 8 + lVar12) = (short)CVar7;
                (decl.redir)->marked = (decl.redir)->marked | 0x20;
                (local_6b8->name).gcptr32 = (uint32_t)decl.redir;
              }
            }
LAB_0014d0c0:
            (decl.name)->marked = (decl.name)->marked | 0x20;
            (ct->name).gcptr32 = (uint32_t)decl.name;
            lj_ctype_addname(*(CTState **)((long)ud + 0x40),ct,id);
          }
          iVar8 = cp_opt((CPState *)ud,0x2c);
          if (iVar8 == 0) goto code_r0x0014d0ea;
          cp_decl_reset(&decl);
        } while( true );
      }
      goto LAB_0014d0ed;
    }
    hashline = *(BCLine *)((long)ud + 0x58);
    CVar9 = cp_next((CPState *)ud);
    if (CVar9 == 0x100) {
      lVar2 = *(long *)((long)ud + 0x10);
      if (*(int *)(lVar2 + 0xc) != 6) {
        if ((*(int *)(lVar2 + 0xc) == 4) && (*(int *)(lVar2 + 0x10) == 0x656e696c)) {
          CVar9 = cp_next((CPState *)ud);
          if (CVar9 != 0x102) {
            cp_err_token((CPState *)ud,0x100);
          }
          goto LAB_0014d152;
        }
        goto LAB_0014d2ab;
      }
      iVar8 = bcmp((void *)(lVar2 + 0x10),"pragma",6);
      if (iVar8 != 0) goto LAB_0014d2ab;
      cp_next((CPState *)ud);
      iVar8 = *(int *)((long)ud + 4);
      if (((iVar8 != 0x100) || (*(int *)(*(long *)((long)ud + 0x10) + 0xc) != 4)) ||
         (*(int *)(*(long *)((long)ud + 0x10) + 0x10) != 0x6b636170)) {
        while ((iVar8 != 0x103 && (*(int *)((long)ud + 0x58) == hashline))) {
          cp_next((CPState *)ud);
          iVar8 = *(int *)((long)ud + 4);
        }
        goto LAB_0014cf05;
      }
      cp_next((CPState *)ud);
      cp_check((CPState *)ud,0x28);
      iVar8 = *(int *)((long)ud + 4);
      if (iVar8 != 0x100) {
LAB_0014d263:
        if (iVar8 == 0x102) {
          uVar6 = *(uint *)((long)ud + 8);
          iVar8 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar8 == 0; iVar8 = iVar8 + -1) {
            }
          }
          uVar3 = (undefined1)iVar8;
          if (uVar6 == 0) {
            uVar3 = 0;
          }
          *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x6f) + 0x68) = uVar3;
          cp_next((CPState *)ud);
        }
        else {
          *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x6f) + 0x68) = 0xff;
        }
LAB_0014d28e:
        cp_check((CPState *)ud,0x29);
        goto LAB_0014cf05;
      }
      lVar2 = *(long *)((long)ud + 0x10);
      if (*(int *)(lVar2 + 0xc) == 3) {
        iVar8 = bcmp((void *)(lVar2 + 0x10),"pop",3);
        if (iVar8 == 0) {
          if (*(char *)((long)ud + 0x6f) != '\0') {
            cVar5 = *(char *)((long)ud + 0x6f) + -1;
            goto LAB_0014d246;
          }
          goto LAB_0014d249;
        }
      }
      else if ((*(int *)(lVar2 + 0xc) == 4) && (*(int *)(lVar2 + 0x10) == 0x68737570)) {
        uVar11 = (ulong)*(byte *)((long)ud + 0x6f);
        if (5 < uVar11) {
          CVar9 = 0x100;
          em = LJ_ERR_XLEVELS;
          goto LAB_0014d2b6;
        }
        *(undefined1 *)((long)ud + uVar11 + 0x69) = *(undefined1 *)((long)ud + uVar11 + 0x68);
        cVar5 = *(char *)((long)ud + 0x6f) + '\x01';
LAB_0014d246:
        *(char *)((long)ud + 0x6f) = cVar5;
LAB_0014d249:
        cp_next((CPState *)ud);
        iVar8 = cp_opt((CPState *)ud,0x2c);
        if (iVar8 != 0) {
          iVar8 = *(int *)((long)ud + 4);
          goto LAB_0014d263;
        }
        goto LAB_0014d28e;
      }
      CVar9 = 0x100;
    }
    else {
      if (CVar9 == 0x102) {
LAB_0014d152:
        cp_line((CPState *)ud,hashline);
        goto LAB_0014cf05;
      }
LAB_0014d2ab:
      CVar9 = *(CPToken *)((long)ud + 4);
    }
    em = LJ_ERR_XSYMBOL;
LAB_0014d2b6:
    cp_errmsg((CPState *)ud,CVar9,em);
  }
  goto LAB_0014cec9;
code_r0x0014d0ea:
  iVar8 = *(int *)((long)ud + 4);
LAB_0014d0ed:
  if (bVar4 && iVar8 == 0x103) goto LAB_0014cec9;
  cp_check((CPState *)ud,0x3b);
LAB_0014d115:
  bVar4 = false;
  goto LAB_0014cf05;
}

Assistant:

static TValue *cpcparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  CPState *cp = (CPState *)ud;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  cp_init(cp);
  if ((cp->mode & CPARSE_MODE_MULTI))
    cp_decl_multi(cp);
  else
    cp_decl_single(cp);
  if (cp->param && cp->param != cp->L->top)
    cp_err(cp, LJ_ERR_FFI_NUMPARAM);
  lj_assertCP(cp->depth == 0, "unbalanced cparser declaration depth");
  return NULL;
}